

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void stbi__de_iphone(stbi__png *z)

{
  stbi_uc sVar1;
  byte bVar2;
  stbi__context *psVar3;
  int iVar4;
  stbi_uc *psVar5;
  byte bVar6;
  int *piVar7;
  long lVar8;
  uint uVar9;
  long *in_FS_OFFSET;
  
  psVar3 = z->s;
  psVar5 = z->out;
  iVar4 = psVar3->img_y * psVar3->img_x;
  if (psVar3->img_out_n == 4) {
    piVar7 = &stbi__unpremultiply_on_load_global;
    if (*(int *)((long)in_FS_OFFSET + -0xc) != 0) {
      piVar7 = (int *)(*in_FS_OFFSET + -0x10);
    }
    if (*piVar7 == 0) {
      if (iVar4 != 0) {
        lVar8 = 0;
        do {
          sVar1 = psVar5[lVar8 * 4];
          psVar5[lVar8 * 4] = psVar5[lVar8 * 4 + 2];
          psVar5[lVar8 * 4 + 2] = sVar1;
          lVar8 = lVar8 + 1;
        } while (iVar4 != (int)lVar8);
      }
    }
    else if (iVar4 != 0) {
      lVar8 = 0;
      do {
        bVar6 = psVar5[lVar8 * 4 + 3];
        bVar2 = psVar5[lVar8 * 4];
        if (bVar6 == 0) {
          psVar5[lVar8 * 4] = psVar5[lVar8 * 4 + 2];
          psVar5[lVar8 * 4 + 2] = bVar2;
        }
        else {
          uVar9 = (uint)bVar6;
          bVar6 = bVar6 >> 1;
          psVar5[lVar8 * 4] =
               (stbi_uc)((((uint)psVar5[lVar8 * 4 + 2] * 0x100 - (uint)psVar5[lVar8 * 4 + 2]) +
                         (uint)bVar6) / uVar9);
          psVar5[lVar8 * 4 + 1] =
               (stbi_uc)((((uint)psVar5[lVar8 * 4 + 1] * 0x100 - (uint)psVar5[lVar8 * 4 + 1]) +
                         (uint)bVar6) / uVar9);
          psVar5[lVar8 * 4 + 2] =
               (stbi_uc)((((uint)bVar2 * 0x100 - (uint)bVar2) + (uint)bVar6) / uVar9);
        }
        lVar8 = lVar8 + 1;
      } while (iVar4 != (int)lVar8);
    }
  }
  else {
    if (psVar3->img_out_n != 3) {
      __assert_fail("s->img_out_n == 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/knosvoxel[P]OpenGL-Project-Template/include/stb_image/stb_image.h"
                    ,0x1379,"void stbi__de_iphone(stbi__png *)");
    }
    for (; iVar4 != 0; iVar4 = iVar4 + -1) {
      sVar1 = *psVar5;
      *psVar5 = psVar5[2];
      psVar5[2] = sVar1;
      psVar5 = psVar5 + 3;
    }
  }
  return;
}

Assistant:

static void stbi__de_iphone(stbi__png *z)
{
   stbi__context *s = z->s;
   stbi__uint32 i, pixel_count = s->img_x * s->img_y;
   stbi_uc *p = z->out;

   if (s->img_out_n == 3) {  // convert bgr to rgb
      for (i=0; i < pixel_count; ++i) {
         stbi_uc t = p[0];
         p[0] = p[2];
         p[2] = t;
         p += 3;
      }
   } else {
      STBI_ASSERT(s->img_out_n == 4);
      if (stbi__unpremultiply_on_load) {
         // convert bgr to rgb and unpremultiply
         for (i=0; i < pixel_count; ++i) {
            stbi_uc a = p[3];
            stbi_uc t = p[0];
            if (a) {
               stbi_uc half = a / 2;
               p[0] = (p[2] * 255 + half) / a;
               p[1] = (p[1] * 255 + half) / a;
               p[2] = ( t   * 255 + half) / a;
            } else {
               p[0] = p[2];
               p[2] = t;
            }
            p += 4;
         }
      } else {
         // convert bgr to rgb
         for (i=0; i < pixel_count; ++i) {
            stbi_uc t = p[0];
            p[0] = p[2];
            p[2] = t;
            p += 4;
         }
      }
   }
}